

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O2

Vec_Ptr_t * Abc_NodeFindCone_rec(Abc_Obj_t *pNode)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *vSuper;
  Abc_Obj_t *pAVar5;
  void *pvVar6;
  Abc_Obj_t *pAVar7;
  int i;
  Abc_Obj_t *pNodeE;
  Abc_Obj_t *pNodeT;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                  ,0x1ca,"Vec_Ptr_t *Abc_NodeFindCone_rec(Abc_Obj_t *)");
  }
  uVar2 = *(uint *)&pNode->field_0x14 & 0xf;
  vSuper = (Vec_Ptr_t *)0x0;
  if ((uVar2 != 2) && (uVar2 != 5)) {
    vSuper = Vec_PtrAlloc(4);
    iVar3 = Abc_NodeIsMuxType(pNode);
    if (iVar3 == 0) {
      i = 0;
      iVar4 = Abc_NodeBalanceCone_rec(pNode,vSuper,1,1,0);
      iVar3 = vSuper->nSize;
      if (iVar3 < 2) {
        __assert_fail("vNodes->nSize > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                      ,0x1db,"Vec_Ptr_t *Abc_NodeFindCone_rec(Abc_Obj_t *)");
      }
      for (; i < iVar3; i = i + 1) {
        pvVar6 = Vec_PtrEntry(vSuper,i);
        pbVar1 = (byte *)(((ulong)pvVar6 & 0xfffffffffffffffe) + 0x14);
        *pbVar1 = *pbVar1 & 0xdf;
        iVar3 = vSuper->nSize;
      }
      if (iVar4 == -1) {
        vSuper->nSize = 0;
      }
    }
    else {
      pAVar5 = Abc_NodeRecognizeMux(pNode,&pNodeT,&pNodeE);
      Vec_PtrPush(vSuper,(void *)((ulong)pAVar5 & 0xfffffffffffffffe));
      Vec_PtrPushUnique(vSuper,(void *)((ulong)pNodeT & 0xfffffffffffffffe));
      Vec_PtrPushUnique(vSuper,(void *)((ulong)pNodeE & 0xfffffffffffffffe));
    }
    for (iVar3 = 0; iVar3 < vSuper->nSize; iVar3 = iVar3 + 1) {
      pvVar6 = Vec_PtrEntry(vSuper,iVar3);
      pAVar5 = (Abc_Obj_t *)((ulong)pvVar6 & 0xfffffffffffffffe);
      if ((pAVar5->field_6).pTemp == (void *)0x0) {
        pAVar7 = (Abc_Obj_t *)Abc_NodeFindCone_rec(pAVar5);
        (pAVar5->field_6).pCopy = pAVar7;
      }
    }
  }
  return vSuper;
}

Assistant:

Vec_Ptr_t * Abc_NodeFindCone_rec( Abc_Obj_t * pNode )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNodeC, * pNodeT, * pNodeE;
    int RetValue, i;
    assert( !Abc_ObjIsComplement(pNode) );
    if ( Abc_ObjIsCi(pNode) )
        return NULL;
    // start the new array
    vNodes = Vec_PtrAlloc( 4 );
    // if the node is the MUX collect its fanins
    if ( Abc_NodeIsMuxType(pNode) )
    {
        pNodeC = Abc_NodeRecognizeMux( pNode, &pNodeT, &pNodeE );
        Vec_PtrPush( vNodes, Abc_ObjRegular(pNodeC) );
        Vec_PtrPushUnique( vNodes, Abc_ObjRegular(pNodeT) );
        Vec_PtrPushUnique( vNodes, Abc_ObjRegular(pNodeE) );
    }
    else
    {
        // collect the nodes in the implication supergate
        RetValue = Abc_NodeBalanceCone_rec( pNode, vNodes, 1, 1, 0 );
        assert( vNodes->nSize > 1 );
        // unmark the visited nodes
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
            Abc_ObjRegular(pNode)->fMarkB = 0;
        // if we found the node and its complement in the same implication supergate, 
        // return empty set of nodes (meaning that we should use constant-0 node)
        if ( RetValue == -1 )
            vNodes->nSize = 0;
    }
    // call for the fanin
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        pNode = Abc_ObjRegular(pNode);
        if ( pNode->pCopy )
            continue;
        pNode->pCopy = (Abc_Obj_t *)Abc_NodeFindCone_rec( pNode );
    }
    return vNodes;
}